

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadLght_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  Node *msh;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  Light *this_00;
  _Elt_pointer psVar5;
  LineSplitter *splitter_00;
  Logger *pLVar6;
  ostream *poVar7;
  ChunkInfo *pCVar8;
  LineSplitter *this_01;
  uint uVar9;
  char *pcVar10;
  ai_real aVar11;
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1f0 [4];
  char *rgb;
  Logger *local_1b0;
  shared_ptr<Assimp::COB::Node> local_1a8 [23];
  
  if (nfo->version < 9) {
    pCVar8 = nfo;
    this_00 = (Light *)operator_new(0xf0);
    COB::Light::Light(this_00);
    std::__shared_ptr<Assimp::COB::Light,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Assimp::COB::Light,void>
              ((__shared_ptr<Assimp::COB::Light,(__gnu_cxx::_Lock_policy)2> *)&local_1f8,this_00);
    local_1a8[0].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_1f8;
    local_1a8[0].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = a_Stack_1f0[0]._M_pi;
    local_1f8 = (element_type *)0x0;
    a_Stack_1f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>::
    emplace_back<std::shared_ptr<Assimp::COB::Node>>
              ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
                *)out,local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1a8[0].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1f0);
    psVar5 = (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar5 == (out->nodes).
                  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pCVar8 = (ChunkInfo *)
               (out->nodes).
               super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
      psVar5 = (_Elt_pointer)(*(long *)&pCVar8[-1].version + 0x200);
    }
    msh = psVar5[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar9 = nfo->parent_id;
    uVar1 = nfo->version;
    uVar2 = nfo->size;
    (msh->super_ChunkInfo).id = nfo->id;
    (msh->super_ChunkInfo).parent_id = uVar9;
    (msh->super_ChunkInfo).version = uVar1;
    (msh->super_ChunkInfo).size = uVar2;
    this_01 = splitter;
    splitter_00 = LineSplitter::operator++(splitter);
    ReadBasicNodeInfo_Ascii((COBImporter *)this_01,msh,splitter_00,pCVar8);
    bVar3 = LineSplitter::match_start(splitter,"Infinite ");
    if (bVar3) {
      uVar9 = 2;
    }
    else {
      bVar3 = LineSplitter::match_start(splitter,"Local ");
      if (bVar3) {
        uVar9 = 1;
      }
      else {
        bVar3 = LineSplitter::match_start(splitter,"Spot ");
        uVar9 = 0;
        if (!bVar3) {
          local_1b0 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[46]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,(char (*) [46])"Unknown kind of light source in `Lght` chunk ");
          poVar7 = (ostream *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             local_1a8,&nfo->id);
          std::operator<<(poVar7," : ");
          std::__cxx11::string::string((string *)&rgb,(string *)&splitter->mCur);
          std::operator<<(poVar7,(string *)&rgb);
          std::__cxx11::stringbuf::str();
          Logger::warn(local_1b0,(char *)local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&rgb);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        }
      }
    }
    msh[1].super_ChunkInfo.version = uVar9;
    LineSplitter::operator++(splitter);
    bVar3 = LineSplitter::match_start(splitter,"color ");
    if (!bVar3) {
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[39]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [39])"Expected `color` line in `Lght` chunk ");
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                 &nfo->id);
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar6,(char *)local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    rgb = LineSplitter::operator[](splitter,1);
    ReadFloat3Tuple_Ascii<aiColor3D>(this,(aiColor3D *)&msh->field_0xd4,&rgb);
    SkipSpaces<char>(&rgb);
    pcVar10 = rgb;
    iVar4 = strncmp(rgb,"cone angle",10);
    if (iVar4 != 0) {
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[62]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [62])"Expected `cone angle` entity in `color` line in `Lght` chunk ");
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                 &nfo->id);
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar6,(char *)local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      pcVar10 = rgb;
    }
    SkipSpaces<char>(pcVar10 + 10,&rgb);
    aVar11 = fast_atof(&rgb);
    msh[1].super_ChunkInfo.id = (uint)aVar11;
    SkipSpaces<char>(&rgb);
    pcVar10 = rgb;
    iVar4 = strncmp(rgb,"inner angle",0xb);
    if (iVar4 != 0) {
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[63]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [63])"Expected `inner angle` entity in `color` line in `Lght` chunk ");
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                 &nfo->id);
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar6,(char *)local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      pcVar10 = rgb;
    }
    SkipSpaces<char>(pcVar10 + 0xb,&rgb);
    aVar11 = fast_atof(&rgb);
    msh[1].super_ChunkInfo.parent_id = (uint)aVar11;
    return;
  }
  UnsupportedChunk_Ascii(this,splitter,nfo,"Lght");
  return;
}

Assistant:

void COBImporter::ReadLght_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Lght");
    }

    out.nodes.push_back(std::shared_ptr<Light>(new Light()));
    Light& msh = (Light&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    if (splitter.match_start("Infinite ")) {
        msh.ltype = Light::INFINITE;
    }
    else if (splitter.match_start("Local ")) {
        msh.ltype = Light::LOCAL;
    }
    else if (splitter.match_start("Spot ")) {
        msh.ltype = Light::SPOT;
    }
    else {
        ASSIMP_LOG_WARN_F( "Unknown kind of light source in `Lght` chunk ", nfo.id, " : ", *splitter );
        msh.ltype = Light::SPOT;
    }

    ++splitter;
    if (!splitter.match_start("color ")) {
        ASSIMP_LOG_WARN_F( "Expected `color` line in `Lght` chunk ", nfo.id );
    }

    const char* rgb = splitter[1];
    ReadFloat3Tuple_Ascii(msh.color ,&rgb);

    SkipSpaces(&rgb);
    if (strncmp(rgb,"cone angle",10) != 0) {
        ASSIMP_LOG_WARN_F( "Expected `cone angle` entity in `color` line in `Lght` chunk ", nfo.id );
    }
    SkipSpaces(rgb+10,&rgb);
    msh.angle = fast_atof(&rgb);

    SkipSpaces(&rgb);
    if (strncmp(rgb,"inner angle",11) != 0) {
        ASSIMP_LOG_WARN_F( "Expected `inner angle` entity in `color` line in `Lght` chunk ", nfo.id);
    }
    SkipSpaces(rgb+11,&rgb);
    msh.inner_angle = fast_atof(&rgb);

    // skip the rest for we can't handle this kind of physically-based lighting information.
}